

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

const_iterator
cmRemoveDuplicates<std::vector<cmTarget*,std::allocator<cmTarget*>>>
          (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *r)

{
  bool bVar1;
  size_type __n;
  bool local_109;
  value_type local_d0;
  const_iterator local_c8;
  cmTarget **local_c0;
  cmTarget **local_b8;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_b0;
  cmTarget **local_a8;
  value_type local_a0;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_98;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_90;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_88;
  iterator low;
  const_iterator local_78;
  const_iterator it;
  __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
  local_68;
  const_iterator end;
  size_t count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  undefined1 local_30 [8];
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> unique;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *r_local;
  
  unique.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)r;
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30);
  __n = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::size
                  ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)
                   unique.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::reserve
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  end._M_current = (cmTarget **)0x0;
  it._M_current =
       (cmTarget **)
       std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                 ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)
                  unique.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>::
  __normal_iterator<cmTarget**>
            ((__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>> *)
             &local_68,
             (__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
              *)&it);
  low = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                  ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)
                   unique.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>::
  __normal_iterator<cmTarget**>
            ((__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>> *)
             &local_78,&low);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_68);
    if (!bVar1) break;
    local_90._M_current =
         (cmTarget **)
         std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                   ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30);
    local_98._M_current =
         (cmTarget **)
         std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                   ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30);
    local_a8 = local_78._M_current;
    local_a0 = ContainerAlgorithms::
               RemoveDuplicatesAPI<std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>,_cmTarget_*>
               ::uniqueValue(local_78);
    local_88 = std::
               lower_bound<__gnu_cxx::__normal_iterator<cmTarget**,std::vector<cmTarget*,std::allocator<cmTarget*>>>,cmTarget*,bool(*)(cmTarget*,cmTarget*)>
                         (local_90,local_98,&local_a0,
                          ContainerAlgorithms::
                          RemoveDuplicatesAPI<std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>,_cmTarget_*>
                          ::lessThan);
    local_b0._M_current =
         (cmTarget **)
         std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                   ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30);
    bVar1 = __gnu_cxx::operator==(&local_88,&local_b0);
    local_109 = true;
    if (!bVar1) {
      local_b8 = local_88._M_current;
      local_c0 = local_78._M_current;
      local_109 = ContainerAlgorithms::
                  RemoveDuplicatesAPI<std::vector<cmTarget*,std::allocator<cmTarget*>>,cmTarget*>::
                  valueCompare<__gnu_cxx::__normal_iterator<cmTarget**,std::vector<cmTarget*,std::allocator<cmTarget*>>>>
                            (local_88,local_78);
    }
    if (local_109 == false) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,
                 (value_type_conflict *)&end);
    }
    else {
      __gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>
      ::__normal_iterator<cmTarget**>
                ((__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>
                  *)&local_c8,&local_88);
      local_d0 = ContainerAlgorithms::
                 RemoveDuplicatesAPI<std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>,_cmTarget_*>
                 ::uniqueValue(local_78);
      std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::insert
                ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30,local_c8,&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
    operator++(&local_78);
    end._M_current = end._M_current + 1;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  if (bVar1) {
    r_local = (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68._M_current;
  }
  else {
    r_local = (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)
              cmRemoveIndices<std::vector<cmTarget*,std::allocator<cmTarget*>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)
                         unique.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_30);
  return (const_iterator)(cmTarget **)r_local;
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for(typename Range::const_iterator it = r.begin();
      it != end; ++it, ++count)
    {
    const typename std::vector<T>::iterator low =
        std::lower_bound(unique.begin(), unique.end(),
                         API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it))
      {
      unique.insert(low, API::uniqueValue(it));
      }
    else
      {
      indices.push_back(count);
      }
    }
  if (indices.empty())
    {
    return end;
    }
  return cmRemoveIndices(r, indices);
}